

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

long __thiscall MemoryArrayReader::Read(MemoryArrayReader *this,void *buffer,long len)

{
  long *plVar1;
  long lVar2;
  size_t sVar3;
  size_t __n;
  
  lVar2 = (this->super_FileReader).FilePos;
  sVar3 = (this->super_FileReader).Length - lVar2;
  if (len <= (long)sVar3) {
    sVar3 = len;
  }
  __n = 0;
  if (0 < (long)sVar3) {
    __n = sVar3;
  }
  memcpy(buffer,(this->buf).Array + lVar2,__n);
  plVar1 = &(this->super_FileReader).FilePos;
  *plVar1 = *plVar1 + __n;
  return __n;
}

Assistant:

long MemoryArrayReader::Read (void *buffer, long len)
{
    if (len>Length-FilePos) len=Length-FilePos;
    if (len<0) len=0;
    memcpy(buffer,&buf[FilePos],len);
    FilePos+=len;
    return len;
}